

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void aarch64_sync_32_to_64_arm(CPUARMState *env)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  
  uVar3 = env->uncached_cpsr;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    env->xregs[lVar4] = (ulong)env->regs[lVar4];
  }
  uVar3 = uVar3 & 0x1f;
  lVar4 = 0;
  if (uVar3 == 0x11) {
    for (; lVar4 != 5; lVar4 = lVar4 + 1) {
      env->xregs[lVar4 + 8] = (ulong)env->usr_regs[lVar4];
    }
  }
  else {
    for (; lVar4 != 5; lVar4 = lVar4 + 1) {
      env->xregs[lVar4 + 8] = (ulong)env->regs[lVar4 + 8];
    }
  }
  if ((uVar3 == 0x1f) || (uVar3 == 0x10)) {
    auVar2._8_4_ = (int)(*(ulong *)(env->regs + 0xd) >> 0x20);
    auVar2._0_8_ = *(ulong *)(env->regs + 0xd) & 0xffffffff;
    auVar2._12_4_ = 0;
    *(undefined1 (*) [16])(env->xregs + 0xd) = auVar2;
LAB_0052f595:
    if (uVar3 == 0x1a) goto LAB_0052f5e2;
    env->xregs[0xf] = (ulong)env->banked_r13[6];
    if (uVar3 != 0x12) goto LAB_0052f5ec;
    uVar1 = env->regs[0xd];
    env->xregs[0x10] = (ulong)env->regs[0xe];
    env->xregs[0x11] = (ulong)uVar1;
LAB_0052f621:
    uVar1 = env->banked_r13[1];
    env->xregs[0x12] = (ulong)env->banked_r14[1];
    env->xregs[0x13] = (ulong)uVar1;
    if (uVar3 != 0x17) goto LAB_0052f656;
    uVar1 = env->regs[0xd];
    env->xregs[0x14] = (ulong)env->regs[0xe];
    env->xregs[0x15] = (ulong)uVar1;
LAB_0052f68b:
    uVar1 = env->banked_r13[3];
    env->xregs[0x16] = (ulong)env->banked_r14[3];
    env->xregs[0x17] = (ulong)uVar1;
    if (uVar3 == 0x11) {
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        env->banked_spsr[lVar4 + -0xc] = (ulong)env->regs[lVar4 + 8];
      }
      goto LAB_0052f6f9;
    }
  }
  else {
    env->xregs[0xd] = (ulong)env->banked_r13[0];
    if (uVar3 != 0x1a) {
      env->xregs[0xe] = (ulong)env->banked_r14[0];
      goto LAB_0052f595;
    }
    env->xregs[0xe] = (ulong)env->regs[0xe];
LAB_0052f5e2:
    env->xregs[0xf] = (ulong)env->regs[0xd];
LAB_0052f5ec:
    uVar1 = env->banked_r13[4];
    env->xregs[0x10] = (ulong)env->banked_r14[4];
    env->xregs[0x11] = (ulong)uVar1;
    if (uVar3 != 0x13) goto LAB_0052f621;
    uVar1 = env->regs[0xd];
    env->xregs[0x12] = (ulong)env->regs[0xe];
    env->xregs[0x13] = (ulong)uVar1;
LAB_0052f656:
    uVar1 = env->banked_r13[2];
    env->xregs[0x14] = (ulong)env->banked_r14[2];
    env->xregs[0x15] = (ulong)uVar1;
    if (uVar3 != 0x1b) goto LAB_0052f68b;
    uVar3 = env->regs[0xd];
    env->xregs[0x16] = (ulong)env->regs[0xe];
    env->xregs[0x17] = (ulong)uVar3;
  }
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    env->banked_spsr[lVar4 + -0xc] = (ulong)env->fiq_regs[lVar4];
  }
  uVar3 = env->banked_r14[5];
  env->xregs[0x1d] = (ulong)env->banked_r13[5];
  env->xregs[0x1e] = (ulong)uVar3;
LAB_0052f6f9:
  env->pc = (ulong)env->regs[0xf];
  return;
}

Assistant:

void aarch64_sync_32_to_64(CPUARMState *env)
{
    int i;
    uint32_t mode = env->uncached_cpsr & CPSR_M;

    /* We can blanket copy R[0:7] to X[0:7] */
    for (i = 0; i < 8; i++) {
        env->xregs[i] = env->regs[i];
    }

    /*
     * Unless we are in FIQ mode, x8-x12 come from the user registers r8-r12.
     * Otherwise, they come from the banked user regs.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 8; i < 13; i++) {
            env->xregs[i] = env->usr_regs[i - 8];
        }
    } else {
        for (i = 8; i < 13; i++) {
            env->xregs[i] = env->regs[i];
        }
    }

    /*
     * Registers x13-x23 are the various mode SP and FP registers. Registers
     * r13 and r14 are only copied if we are in that mode, otherwise we copy
     * from the mode banked register.
     */
    if (mode == ARM_CPU_MODE_USR || mode == ARM_CPU_MODE_SYS) {
        env->xregs[13] = env->regs[13];
        env->xregs[14] = env->regs[14];
    } else {
        env->xregs[13] = env->banked_r13[bank_number(ARM_CPU_MODE_USR)];
        /* HYP is an exception in that it is copied from r14 */
        if (mode == ARM_CPU_MODE_HYP) {
            env->xregs[14] = env->regs[14];
        } else {
            env->xregs[14] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_USR)];
        }
    }

    if (mode == ARM_CPU_MODE_HYP) {
        env->xregs[15] = env->regs[13];
    } else {
        env->xregs[15] = env->banked_r13[bank_number(ARM_CPU_MODE_HYP)];
    }

    if (mode == ARM_CPU_MODE_IRQ) {
        env->xregs[16] = env->regs[14];
        env->xregs[17] = env->regs[13];
    } else {
        env->xregs[16] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_IRQ)];
        env->xregs[17] = env->banked_r13[bank_number(ARM_CPU_MODE_IRQ)];
    }

    if (mode == ARM_CPU_MODE_SVC) {
        env->xregs[18] = env->regs[14];
        env->xregs[19] = env->regs[13];
    } else {
        env->xregs[18] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_SVC)];
        env->xregs[19] = env->banked_r13[bank_number(ARM_CPU_MODE_SVC)];
    }

    if (mode == ARM_CPU_MODE_ABT) {
        env->xregs[20] = env->regs[14];
        env->xregs[21] = env->regs[13];
    } else {
        env->xregs[20] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_ABT)];
        env->xregs[21] = env->banked_r13[bank_number(ARM_CPU_MODE_ABT)];
    }

    if (mode == ARM_CPU_MODE_UND) {
        env->xregs[22] = env->regs[14];
        env->xregs[23] = env->regs[13];
    } else {
        env->xregs[22] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_UND)];
        env->xregs[23] = env->banked_r13[bank_number(ARM_CPU_MODE_UND)];
    }

    /*
     * Registers x24-x30 are mapped to r8-r14 in FIQ mode.  If we are in FIQ
     * mode, then we can copy from r8-r14.  Otherwise, we copy from the
     * FIQ bank for r8-r14.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 24; i < 31; i++) {
            env->xregs[i] = env->regs[i - 16];   /* X[24:30] <- R[8:14] */
        }
    } else {
        for (i = 24; i < 29; i++) {
            env->xregs[i] = env->fiq_regs[i - 24];
        }
        env->xregs[29] = env->banked_r13[bank_number(ARM_CPU_MODE_FIQ)];
        env->xregs[30] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_FIQ)];
    }

    env->pc = env->regs[15];
}